

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O0

Result __thiscall
spectest::JSONParser::ParseConstVector(JSONParser *this,ValueTypes *out_types,Values *out_values)

{
  bool bVar1;
  bool bVar2;
  Result RVar3;
  undefined1 local_50 [8];
  TypedValue tv;
  bool first;
  Values *out_values_local;
  ValueTypes *out_types_local;
  JSONParser *this_local;
  
  std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::clear(out_values);
  RVar3 = Expect(this,"[");
  bVar1 = wabt::Failed(RVar3);
  if (bVar1) {
    wabt::Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    bVar1 = true;
    while (bVar2 = Match(this,"]"), ((bVar2 ^ 0xffU) & 1) != 0) {
      if (!bVar1) {
        tv.value._12_4_ = Expect(this,",");
        bVar1 = wabt::Failed((Result)tv.value._12_4_);
        if (bVar1) {
          wabt::Result::Result((Result *)((long)&this_local + 4),Error);
          return (Result)this_local._4_4_;
        }
      }
      RVar3 = ParseConst(this,(TypedValue *)local_50);
      bVar1 = wabt::Failed(RVar3);
      if (bVar1) {
        wabt::Result::Result((Result *)((long)&this_local + 4),Error);
        return (Result)this_local._4_4_;
      }
      std::vector<wabt::Type,_std::allocator<wabt::Type>_>::push_back
                (out_types,(value_type *)local_50);
      std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::push_back
                (out_values,(value_type *)&tv);
      bVar1 = false;
    }
    wabt::Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  return (Result)this_local._4_4_;
}

Assistant:

wabt::Result JSONParser::ParseConstVector(ValueTypes* out_types, Values* out_values) {
  out_values->clear();
  EXPECT("[");
  bool first = true;
  while (!Match("]")) {
    if (!first) {
      EXPECT(",");
    }
    TypedValue tv;
    CHECK_RESULT(ParseConst(&tv));
    out_types->push_back(tv.type);
    out_values->push_back(tv.value);
    first = false;
  }
  return wabt::Result::Ok;
}